

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderVelocity.cpp
# Opt level: O0

void __thiscall
EncoderVelocity::SetDataRev6(EncoderVelocity *this,uint32_t rawPeriod,uint32_t rawQtr)

{
  uint32_t rawQtr_local;
  uint32_t rawPeriod_local;
  EncoderVelocity *this_local;
  
  Init(this);
  this->clkPeriod = 3.255208333333333e-07;
  this->velPeriodMax = 0x3fffff;
  this->qtrPeriodMax = 0xfffff;
  this->velPeriod = rawPeriod & 0x3fffff;
  this->qtr1Period = (rawQtr & 0xfff00000) >> 0xc | (rawPeriod & 0x3fc00000) >> 0x16;
  this->qtr5Period = rawQtr & 0xfffff;
  this->velOverflow = (rawPeriod & 0x80000000) != 0;
  this->velDir = (rawPeriod & 0x40000000) != 0;
  if (this->qtr1Period == this->qtrPeriodMax) {
    this->qtr1Overflow = true;
  }
  if (this->qtr5Period == this->qtrPeriodMax) {
    this->qtr5Overflow = true;
  }
  this->qtr1Dir = (bool)(this->velDir & 1);
  this->qtr5Dir = (bool)(this->velDir & 1);
  return;
}

Assistant:

void EncoderVelocity::SetDataRev6(uint32_t rawPeriod, uint32_t rawQtr)
{
    Init();
    clkPeriod = VEL_PERD_REV6;
    velPeriodMax = ENC_VEL_MASK_22;
    qtrPeriodMax = ENC_ACC_PREV_MASK;  // 20 bits
    // Firmware 6 has bits stuffed in different places:
    //   Q1: lower 8 bits in velPeriod[29:22] and upper 12 bits in accQtr1[31:20]
    //   Q5: all 20 bits in accQtr1[19:0]
    velPeriod = rawPeriod & ENC_VEL_MASK_22;
    qtr1Period = (((rawQtr & ENC_ACC_REC_MS_MASK)>>12) |
                  ((rawPeriod & ENC_ACC_REC_LS_MASK) >> 22)) & ENC_ACC_PREV_MASK;
    qtr5Period = rawQtr & ENC_ACC_PREV_MASK;
    velOverflow = rawPeriod & ENC_VEL_OVER_MASK;
    velDir = rawPeriod & ENC_DIR_MASK;
    // Qtr1 and Qtr5 overflow at 0x000fffff (no overflow bit is set by firmware)
    if (qtr1Period == qtrPeriodMax)
        qtr1Overflow = true;
    if (qtr5Period == qtrPeriodMax)
        qtr5Overflow = true;
    // Qtr1 and Qtr5 direction are not recorded, so set them same as velDir;
    // i.e., assume that there hasn't been a direction change.
    qtr1Dir = velDir;
    qtr5Dir = velDir;
}